

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void vkt::memory::anon_unknown_0::createPipelineWithResources
               (DeviceInterface *vkd,VkDevice device,VkRenderPass renderPass,deUint32 subpass,
               VkShaderModule *vertexShaderModule,VkShaderModule *fragmentShaderModule,
               deUint32 viewPortWidth,deUint32 viewPortHeight,
               vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
               *vertexBindingDescriptions,
               vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
               *vertexAttributeDescriptions,
               vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               *bindings,VkPrimitiveTopology topology,deUint32 pushConstantRangeCount,
               VkPushConstantRange *pushConstantRanges,PipelineResources *resources)

{
  VkDescriptorSetLayoutBinding *pVVar1;
  VkDescriptorSetLayoutBinding *pVVar2;
  Handle<(vk::HandleType)18> HVar3;
  Handle<(vk::HandleType)18> HVar4;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  VkAllocationCallbacks *pVVar7;
  long lVar8;
  undefined4 in_register_0000000c;
  ulong uVar9;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000003c;
  VkSampleMask sampleMask;
  VkDescriptorSetLayout descriptorSetLayout_;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_2e8;
  VkRect2D scissors [1];
  VkPipelineShaderStageCreateInfo shaderStages [2];
  VkPipelineLayoutCreateInfo createInfo_1;
  VkDescriptorSetLayoutCreateInfo createInfo;
  VkPipelineColorBlendAttachmentState attachments [1];
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyState;
  VkPipelineMultisampleStateCreateInfo multisampleState;
  VkPipelineViewportStateCreateInfo viewportState;
  VkPipelineVertexInputStateCreateInfo vertexInputState;
  
  pVVar1 = (VkDescriptorSetLayoutBinding *)
           (vertexAttributeDescriptions->
           super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (VkDescriptorSetLayoutBinding *)
           (vertexAttributeDescriptions->
           super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar1 != pVVar2) {
    createInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    createInfo.pNext = (void *)0x0;
    createInfo._16_8_ = ((long)pVVar2 - (long)pVVar1) / 0x18 << 0x20;
    createInfo.pBindings = pVVar1;
    ::vk::createDescriptorSetLayout
              ((Move<vk::Handle<(vk::HandleType)19>_> *)shaderStages,vkd,device,&createInfo,
               (VkAllocationCallbacks *)0x0);
    createInfo_1.flags = shaderStages[0].flags;
    createInfo_1.setLayoutCount = shaderStages[0].stage;
    createInfo_1.pSetLayouts = (VkDescriptorSetLayout *)shaderStages[0].module.m_internal;
    createInfo_1.sType = shaderStages[0].sType;
    createInfo_1._4_4_ = shaderStages[0]._4_4_;
    createInfo_1.pNext = shaderStages[0].pNext;
    shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    shaderStages[0]._4_4_ = 0;
    shaderStages[0].pNext = (void *)0x0;
    shaderStages[0].flags = 0;
    shaderStages[0].stage = 0;
    shaderStages[0].module.m_internal = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
              ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&pushConstantRanges[2].size);
    pushConstantRanges[4].stageFlags = createInfo_1.flags;
    pushConstantRanges[4].offset = createInfo_1.setLayoutCount;
    *(VkDescriptorSetLayout **)&pushConstantRanges[4].size = createInfo_1.pSetLayouts;
    *(undefined8 *)&pushConstantRanges[2].size = createInfo_1._0_8_;
    *(void **)&pushConstantRanges[3].offset = createInfo_1.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)19>_> *)shaderStages);
  }
  createInfo_1.pPushConstantRanges =
       (VkPushConstantRange *)CONCAT44(in_stack_0000003c,pushConstantRangeCount);
  descriptorSetLayout_.m_internal = *(deUint64 *)&pushConstantRanges[2].size;
  createInfo_1.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  createInfo_1.pNext = (void *)0x0;
  createInfo_1.pSetLayouts = (VkDescriptorSetLayout *)descriptorSetLayout_.m_internal;
  if ((VkDescriptorSetLayout *)descriptorSetLayout_.m_internal != (VkDescriptorSetLayout *)0x0) {
    createInfo_1.pSetLayouts = &descriptorSetLayout_;
  }
  createInfo_1._16_8_ =
       (ulong)((VkDescriptorSetLayout *)descriptorSetLayout_.m_internal !=
              (VkDescriptorSetLayout *)0x0) << 0x20;
  createInfo_1.pushConstantRangeCount = topology;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)shaderStages,vkd,device,&createInfo_1,
             (VkAllocationCallbacks *)0x0);
  createInfo.flags = shaderStages[0].flags;
  createInfo.bindingCount = shaderStages[0].stage;
  createInfo.pBindings = (VkDescriptorSetLayoutBinding *)shaderStages[0].module.m_internal;
  createInfo.sType = shaderStages[0].sType;
  createInfo._4_4_ = shaderStages[0]._4_4_;
  createInfo.pNext = shaderStages[0].pNext;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = 0;
  shaderStages[0].module.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&pushConstantRanges[5].offset);
  *(undefined8 *)&pushConstantRanges[6].size = createInfo._16_8_;
  *(VkDescriptorSetLayoutBinding **)&pushConstantRanges[7].offset = createInfo.pBindings;
  pushConstantRanges[5].offset = createInfo.sType;
  pushConstantRanges[5].size = createInfo._4_4_;
  *(void **)(pushConstantRanges + 6) = createInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)shaderStages);
  shaderStages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  shaderStages[0].module.m_internal = *(deUint64 *)CONCAT44(in_register_0000000c,subpass);
  shaderStages[0].pName = "main";
  shaderStages[0].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  shaderStages[1].pNext = (void *)0x0;
  shaderStages[1].flags = 0;
  shaderStages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  shaderStages[1].module = (VkShaderModule)vertexShaderModule->m_internal;
  shaderStages[1].pName = "main";
  shaderStages[1].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  createInfo.pNext = (void *)0x0;
  createInfo.flags = 0;
  createInfo.bindingCount = 0;
  createInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  createInfo._4_4_ = 0;
  createInfo.pBindings = (VkDescriptorSetLayoutBinding *)0x700000000;
  createInfo_1._32_8_ = &vertexInputState;
  vertexInputState.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputState.pNext = (void *)0x0;
  vertexInputState.flags = 0;
  vertexInputState.pVertexBindingDescriptions =
       *(VkVertexInputBindingDescription **)CONCAT44(in_stack_00000014,viewPortHeight);
  lVar8 = ((long *)CONCAT44(in_stack_00000014,viewPortHeight))[1] -
          (long)vertexInputState.pVertexBindingDescriptions;
  if (lVar8 == 0) {
    vertexInputState.pVertexBindingDescriptions =
         (VkVertexInputBindingDescription *)(VkVertexInputAttributeDescription *)0x0;
  }
  vertexInputState.vertexBindingDescriptionCount = (deUint32)(lVar8 / 0xc);
  vertexInputState.pVertexAttributeDescriptions =
       (VkVertexInputAttributeDescription *)
       (vertexBindingDescriptions->
       super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
       )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)(vertexBindingDescriptions->
                super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)vertexInputState.pVertexAttributeDescriptions;
  if (uVar9 == 0) {
    vertexInputState.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  }
  vertexInputState.vertexAttributeDescriptionCount = (deUint32)(uVar9 >> 4);
  createInfo_1.pPushConstantRanges = (VkPushConstantRange *)&inputAssemblyState;
  inputAssemblyState.pNext = (void *)0x0;
  inputAssemblyState.primitiveRestartEnable = 0;
  inputAssemblyState._28_4_ = 0;
  inputAssemblyState.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  inputAssemblyState._4_4_ = 0;
  inputAssemblyState._16_8_ = (long)bindings << 0x20;
  scissors[0].extent.width = (deUint32)fragmentShaderModule;
  scissors[0].offset.x = 0;
  scissors[0].offset.y = 0;
  scissors[0].extent.height = viewPortWidth;
  descriptorSetLayout_.m_internal = 0x17;
  createInfo_1.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  createInfo_1.pNext = (void *)0x0;
  createInfo_1.flags = 0;
  createInfo_1.setLayoutCount = 2;
  createInfo_1.pSetLayouts = (VkDescriptorSetLayout *)shaderStages;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_2e8,vkd,device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)&createInfo_1,(VkAllocationCallbacks *)0x0);
  pVVar7 = local_2e8.m_data.deleter.m_allocator;
  pVVar6 = local_2e8.m_data.deleter.m_device;
  pDVar5 = local_2e8.m_data.deleter.m_deviceIface;
  HVar3.m_internal = local_2e8.m_data.object.m_internal;
  local_2e8.m_data.object.m_internal = 0;
  local_2e8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_2e8.m_data.deleter.m_device = (VkDevice)0x0;
  local_2e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)pushConstantRanges);
  HVar4.m_internal = local_2e8.m_data.object.m_internal;
  *(VkDevice *)&pushConstantRanges[1].offset = pVVar6;
  *(VkAllocationCallbacks **)(pushConstantRanges + 2) = pVVar7;
  local_2e8.m_data.object.m_internal._0_4_ = (undefined4)HVar3.m_internal;
  local_2e8.m_data.object.m_internal._4_4_ = SUB84(HVar3.m_internal,4);
  pushConstantRanges->stageFlags = (undefined4)local_2e8.m_data.object.m_internal;
  pushConstantRanges->offset = local_2e8.m_data.object.m_internal._4_4_;
  *(DeviceInterface **)&pushConstantRanges->size = pDVar5;
  local_2e8.m_data.object.m_internal = HVar4.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_2e8);
  return;
}

Assistant:

void createPipelineWithResources (const vk::DeviceInterface&							vkd,
								  const vk::VkDevice									device,
								  const vk::VkRenderPass								renderPass,
								  const deUint32										subpass,
								  const vk::VkShaderModule&								vertexShaderModule,
								  const vk::VkShaderModule&								fragmentShaderModule,
								  const deUint32										viewPortWidth,
								  const deUint32										viewPortHeight,
								  const vector<vk::VkVertexInputBindingDescription>&	vertexBindingDescriptions,
								  const vector<vk::VkVertexInputAttributeDescription>&	vertexAttributeDescriptions,
								  const vector<vk::VkDescriptorSetLayoutBinding>&		bindings,
								  const vk::VkPrimitiveTopology							topology,
								  deUint32												pushConstantRangeCount,
								  const vk::VkPushConstantRange*						pushConstantRanges,
								  PipelineResources&									resources)
{
	if (!bindings.empty())
	{
		const vk::VkDescriptorSetLayoutCreateInfo createInfo =
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,

			0u,
			(deUint32)bindings.size(),
			bindings.empty() ? DE_NULL : &bindings[0]
		};

		resources.descriptorSetLayout = vk::createDescriptorSetLayout(vkd, device, &createInfo);
	}

	{
		const vk::VkDescriptorSetLayout			descriptorSetLayout_	= *resources.descriptorSetLayout;
		const vk::VkPipelineLayoutCreateInfo	createInfo				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,
			DE_NULL,
			0,

			resources.descriptorSetLayout ? 1u : 0u,
			resources.descriptorSetLayout ? &descriptorSetLayout_ : DE_NULL,

			pushConstantRangeCount,
			pushConstantRanges
		};

		resources.pipelineLayout = vk::createPipelineLayout(vkd, device, &createInfo);
	}

	{
		const vk::VkPipelineShaderStageCreateInfo			shaderStages[]					=
		{
			{
				vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				0,
				vk::VK_SHADER_STAGE_VERTEX_BIT,
				vertexShaderModule,
				"main",
				DE_NULL
			},
			{
				vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				0,
				vk::VK_SHADER_STAGE_FRAGMENT_BIT,
				fragmentShaderModule,
				"main",
				DE_NULL
			}
		};
		const vk::VkPipelineDepthStencilStateCreateInfo		depthStencilState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,
			DE_NULL,
			0u,
			DE_FALSE,
			DE_FALSE,
			vk::VK_COMPARE_OP_ALWAYS,
			DE_FALSE,
			DE_FALSE,
			{
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_COMPARE_OP_ALWAYS,
				0u,
				0u,
				0u,
			},
			{
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_COMPARE_OP_ALWAYS,
				0u,
				0u,
				0u,
			},
			-1.0f,
			+1.0f
		};
		const vk::VkPipelineVertexInputStateCreateInfo		vertexInputState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,
			DE_NULL,
			0u,

			(deUint32)vertexBindingDescriptions.size(),
			vertexBindingDescriptions.empty() ? DE_NULL : &vertexBindingDescriptions[0],

			(deUint32)vertexAttributeDescriptions.size(),
			vertexAttributeDescriptions.empty() ? DE_NULL : &vertexAttributeDescriptions[0]
		};
		const vk::VkPipelineInputAssemblyStateCreateInfo	inputAssemblyState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,
			DE_NULL,
			0,
			topology,
			VK_FALSE
		};
		const vk::VkViewport								viewports[]						=
		{
			{ 0.0f, 0.0f, (float)viewPortWidth, (float)viewPortHeight, 0.0f, 1.0f }
		};
		const vk::VkRect2D									scissors[]						=
		{
			{ { 0, 0 }, { (deUint32)viewPortWidth, (deUint32)viewPortHeight } }
		};
		const vk::VkPipelineViewportStateCreateInfo			viewportState					=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,
			DE_NULL,
			0,
			DE_LENGTH_OF_ARRAY(viewports),
			viewports,
			DE_LENGTH_OF_ARRAY(scissors),
			scissors
		};
		const vk::VkPipelineRasterizationStateCreateInfo	rasterState						=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,
			DE_NULL,
			0,

			VK_TRUE,
			VK_FALSE,
			vk::VK_POLYGON_MODE_FILL,
			vk::VK_CULL_MODE_NONE,
			vk::VK_FRONT_FACE_COUNTER_CLOCKWISE,
			VK_FALSE,
			0.0f,
			0.0f,
			0.0f,
			1.0f
		};
		const vk::VkSampleMask								sampleMask						= ~0u;
		const vk::VkPipelineMultisampleStateCreateInfo		multisampleState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,
			DE_NULL,
			0,

			vk::VK_SAMPLE_COUNT_1_BIT,
			VK_FALSE,
			0.0f,
			&sampleMask,
			VK_FALSE,
			VK_FALSE
		};
		const vk::VkPipelineColorBlendAttachmentState		attachments[]					=
		{
			{
				VK_FALSE,
				vk::VK_BLEND_FACTOR_ONE,
				vk::VK_BLEND_FACTOR_ZERO,
				vk::VK_BLEND_OP_ADD,
				vk::VK_BLEND_FACTOR_ONE,
				vk::VK_BLEND_FACTOR_ZERO,
				vk::VK_BLEND_OP_ADD,
				(vk::VK_COLOR_COMPONENT_R_BIT|
				 vk::VK_COLOR_COMPONENT_G_BIT|
				 vk::VK_COLOR_COMPONENT_B_BIT|
				 vk::VK_COLOR_COMPONENT_A_BIT)
			}
		};
		const vk::VkPipelineColorBlendStateCreateInfo		colorBlendState					=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,
			DE_NULL,
			0,

			VK_FALSE,
			vk::VK_LOGIC_OP_COPY,
			DE_LENGTH_OF_ARRAY(attachments),
			attachments,
			{ 0.0f, 0.0f, 0.0f, 0.0f }
		};
		const vk::VkGraphicsPipelineCreateInfo				createInfo						=
		{
			vk::VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,
			DE_NULL,
			0u,

			DE_LENGTH_OF_ARRAY(shaderStages),
			shaderStages,

			&vertexInputState,
			&inputAssemblyState,
			DE_NULL,
			&viewportState,
			&rasterState,
			&multisampleState,
			&depthStencilState,
			&colorBlendState,
			DE_NULL,
			*resources.pipelineLayout,
			renderPass,
			subpass,
			0,
			0
		};

		resources.pipeline = vk::createGraphicsPipeline(vkd, device, 0, &createInfo);
	}
}